

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcessPrivate::processFinished(QProcessPrivate *this)

{
  QObject *this_00;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
  waitForDeadChild(this);
  cleanup(this,in_RSI);
  if (this->exitStatus == '\x01') {
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    setErrorAndEmit(this,Crashed,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  QIODevice::readChannelFinished((QIODevice *)this_00);
  QProcess::finished((QProcess *)this_00,this->exitCode,(uint)this->exitStatus);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProcessPrivate::processFinished()
{
    Q_Q(QProcess);
#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished()");
#endif

#ifdef Q_OS_UNIX
    waitForDeadChild();
#else
    findExitCode();
#endif

    cleanup();

    if (exitStatus == QProcess::CrashExit)
        setErrorAndEmit(QProcess::Crashed);

    // we received EOF now:
    emit q->readChannelFinished();
    // in the future:
    //emit q->standardOutputClosed();
    //emit q->standardErrorClosed();

    emit q->finished(exitCode, QProcess::ExitStatus(exitStatus));

#if defined QPROCESS_DEBUG
    qDebug("QProcessPrivate::processFinished(): process is dead");
#endif
}